

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O1

int run_test_process_title(void)

{
  uv_loop_t **buffer_00;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  int extraout_EDX;
  void **ppvVar3;
  long *title;
  uv_handle_t *puVar4;
  int64_t eval_b;
  int64_t eval_b_1;
  char buffer [512];
  uv_handle_t auStack_c70 [4];
  uv_loop_t *puStack_b68;
  undefined8 uStack_b58;
  code *pcStack_b50;
  void *pvStack_b48;
  undefined1 auStack_b40 [16];
  uv_process_t uStack_b30;
  uv_loop_t *puStack_ac8;
  char *pcStack_ac0;
  long *plStack_ab8;
  long *plStack_ab0;
  undefined8 uStack_aa8;
  uv_process_options_t uStack_a98;
  long alStack_a48 [63];
  undefined1 uStack_849;
  uv_loop_t uStack_848;
  char *pcStack_448;
  char acStack_420 [512];
  long local_218 [67];
  
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  set_title("new title");
  iVar1 = uv_get_process_title((char *)0x0,100);
  local_218[2] = (long)iVar1;
  local_218[0] = -0x16;
  if (local_218[2] == -0x16) {
    iVar1 = uv_get_process_title((char *)(local_218 + 2),0);
    local_218[0] = (long)iVar1;
    local_218[1] = 0xffffffffffffffea;
    if (local_218[0] != -0x16) goto LAB_001b38df;
    iVar1 = uv_get_process_title((char *)(local_218 + 2),1);
    local_218[0] = (long)iVar1;
    local_218[1] = 0xffffffffffffff97;
    if (local_218[0] == -0x69) {
      return 0;
    }
  }
  else {
    run_test_process_title_cold_1();
LAB_001b38df:
    run_test_process_title_cold_2();
  }
  title = local_218;
  run_test_process_title_cold_3();
  iVar1 = uv_get_process_title(acStack_420,0x200);
  if (iVar1 == 0) {
    iVar1 = uv_set_process_title((char *)title);
    if (iVar1 != 0) goto LAB_001b39b5;
    iVar1 = uv_get_process_title(acStack_420,0x200);
    if (iVar1 != 0) goto LAB_001b39c2;
    iVar1 = strcmp(acStack_420,(char *)title);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    set_title_cold_1();
LAB_001b39b5:
    set_title_cold_2();
LAB_001b39c2:
    set_title_cold_3();
  }
  set_title_cold_4();
  ppvVar3 = &pvStack_b48;
  auStack_b40._8_8_ = (uv_loop_t *)0x3ff;
  loop = &uStack_848;
  pcStack_b50 = (code *)0x1b3a04;
  pcStack_448 = (char *)title;
  iVar1 = uv_exepath((char *)loop,(size_t *)(auStack_b40 + 8));
  alStack_a48[0] = (long)iVar1;
  uStack_b30.data = (void *)0x0;
  if (alStack_a48[0] == 0) {
    *(undefined1 *)((long)(auStack_b40._8_8_ + 0x38) + (long)(uStack_848.reserved + -0xe)) = 0;
    pcStack_b50 = (code *)0x1b3a54;
    memset(alStack_a48,0x78,0x1ff);
    uStack_849 = 0;
    uStack_a98.args = (char **)&puStack_ac8;
    pcStack_ac0 = "process_title_big_argv_helper";
    uStack_aa8 = 0;
    uStack_a98.env = (char **)0x0;
    uStack_a98.cwd = (char *)0x0;
    uStack_a98.flags = 0;
    uStack_a98.stdio_count = 0;
    uStack_a98.stdio = (uv_stdio_container_t *)0x0;
    uStack_a98.uid = 0;
    uStack_a98.gid = 0;
    uStack_a98.cpumask = (char *)0x0;
    uStack_a98.cpumask_size = 0;
    uStack_a98.exit_cb = exit_cb;
    pcStack_b50 = (code *)0x1b3ab7;
    puStack_ac8 = loop;
    plStack_ab8 = alStack_a48;
    plStack_ab0 = alStack_a48;
    uStack_a98.file = (char *)loop;
    puVar2 = uv_default_loop();
    pcStack_b50 = (code *)0x1b3ac7;
    iVar1 = uv_spawn(puVar2,&uStack_b30,&uStack_a98);
    auStack_b40._0_8_ = SEXT48(iVar1);
    pvStack_b48 = (void *)0x0;
    if ((void *)auStack_b40._0_8_ != (void *)0x0) goto LAB_001b3b7a;
    pcStack_b50 = (code *)0x1b3ae6;
    puVar2 = uv_default_loop();
    pcStack_b50 = (code *)0x1b3af0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_b40._0_8_ = SEXT48(iVar1);
    pvStack_b48 = (void *)0x0;
    if ((void *)auStack_b40._0_8_ == (void *)0x0) {
      pcStack_b50 = (code *)0x1b3b0f;
      loop = uv_default_loop();
      pcStack_b50 = (code *)0x1b3b23;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      pcStack_b50 = (code *)0x1b3b2d;
      uv_run(loop,UV_RUN_DEFAULT);
      auStack_b40._0_8_ = (void *)0x0;
      pcStack_b50 = (code *)0x1b3b3b;
      puVar2 = uv_default_loop();
      pcStack_b50 = (code *)0x1b3b43;
      iVar1 = uv_loop_close(puVar2);
      pvStack_b48 = (void *)(long)iVar1;
      if ((void *)auStack_b40._0_8_ == pvStack_b48) {
        pcStack_b50 = (code *)0x1b3b59;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b3b94;
    }
  }
  else {
    pcStack_b50 = (code *)0x1b3b7a;
    run_test_process_title_big_argv_cold_1();
LAB_001b3b7a:
    pcStack_b50 = (code *)0x1b3b87;
    run_test_process_title_big_argv_cold_2();
  }
  pcStack_b50 = (code *)0x1b3b94;
  run_test_process_title_big_argv_cold_3();
LAB_001b3b94:
  puVar4 = (uv_handle_t *)auStack_b40;
  pcStack_b50 = exit_cb;
  run_test_process_title_big_argv_cold_4();
  uStack_b58 = 0;
  if (ppvVar3 == (void **)0x0) {
    pcStack_b50 = (code *)(long)extraout_EDX;
    uStack_b58 = 0;
    if (pcStack_b50 == (code *)0x0) {
      uv_close(puVar4,(uv_close_cb)0x0);
      return extraout_EAX;
    }
  }
  else {
    puStack_b68 = (uv_loop_t *)0x1b3bf6;
    pcStack_b50 = (code *)ppvVar3;
    exit_cb_cold_1();
  }
  puStack_b68 = (uv_loop_t *)process_title_big_argv;
  exit_cb_cold_2();
  buffer_00 = &auStack_c70[0].loop;
  puStack_b68 = loop;
  memset(buffer_00,0,0x100);
  auStack_c70[0].loop._0_4_ = 0x6c696166;
  uv_get_process_title((char *)buffer_00,0x100);
  auStack_c70[0].data = (void *)0x0;
  iVar1 = strcmp((char *)buffer_00,"fail");
  if (auStack_c70[0].data != (void *)(long)iVar1) {
    return (int)auStack_c70[0].data;
  }
  puVar4 = auStack_c70;
  process_title_big_argv_cold_1();
  iVar1 = uv_is_closing(puVar4);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(puVar4,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(process_title) {
#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  /* Check for format string vulnerabilities. */
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  set_title("new title");

  /* Check uv_get_process_title() edge cases */
  uv_get_process_title_edge_cases();

  return 0;
}